

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_ptr mpz_realloc(__mpz_struct *r,mp_size_t size)

{
  uint uVar1;
  uint uVar2;
  mp_limb_t *pmVar3;
  ulong uVar4;
  
  uVar4 = 1;
  if (1 < size) {
    uVar4 = size;
  }
  if (r->_mp_alloc == 0) {
    pmVar3 = (mp_limb_t *)(*gmp_allocate_func)(uVar4 * 8);
  }
  else {
    pmVar3 = (mp_limb_t *)(*gmp_reallocate_func)(r->_mp_d,0,uVar4 * 8);
  }
  r->_mp_d = pmVar3;
  r->_mp_alloc = (int)uVar4;
  uVar1 = r->_mp_size;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar4 < uVar2) {
    r->_mp_size = 0;
  }
  return r->_mp_d;
}

Assistant:

static mp_ptr
mpz_realloc (mpz_t r, mp_size_t size)
{
  size = GMP_MAX (size, 1);

  if (r->_mp_alloc)
    r->_mp_d = gmp_xrealloc_limbs (r->_mp_d, size);
  else
    r->_mp_d = gmp_xalloc_limbs (size);
  r->_mp_alloc = size;

  if (GMP_ABS (r->_mp_size) > size)
    r->_mp_size = 0;

  return r->_mp_d;
}